

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O1

void __thiscall FPalette::MakeGoodRemap(FPalette *this)

{
  uint *puVar1;
  byte bVar2;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  PalEntry sortcopy [256];
  undefined4 local_418;
  byte abStack_411 [1025];
  
  aVar3 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->BaseColors[0].field_0.d;
  lVar6 = 1;
  do {
    if (this->BaseColors[lVar6].field_0.d == aVar3.d) {
      this->Remap[0] = (BYTE)lVar6;
      break;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  if (this->Remap[0] == '\0') {
    uVar5 = 0;
    lVar6 = 0;
    do {
      (&local_418)[lVar6] = this->BaseColors[lVar6].field_0.d | uVar5;
      lVar6 = lVar6 + 1;
      uVar5 = uVar5 + 0x1000000;
    } while (lVar6 != 0x100);
    qsort(&local_418,0x100,4,sortforremap);
    lVar6 = 0xff;
    do {
      lVar7 = lVar6 + -1;
      if (lVar6 == 0) {
        return;
      }
      puVar1 = &local_418 + lVar6;
      lVar6 = lVar7;
    } while ((((&local_418)[lVar7] ^ *puVar1) & 0xffffff) != 0);
    bVar2 = abStack_411[lVar7 * 4];
    bVar4 = *(byte *)((long)&local_418 + lVar7 * 4 + 3);
    bVar8 = bVar4;
    if (bVar2 < bVar4) {
      bVar8 = bVar2;
    }
    if (bVar4 < bVar2) {
      bVar4 = bVar2;
    }
    this->Remap[0] = bVar8;
    this->Remap[bVar8] = bVar4;
    this->BaseColors[bVar8].field_0.d = (uint32)aVar3;
  }
  return;
}

Assistant:

void FPalette::MakeGoodRemap ()
{
	PalEntry color0 = BaseColors[0];
	int i;

	// First try for an exact match of color 0. Only Hexen does not have one.
	for (i = 1; i < 256; ++i)
	{
		if (BaseColors[i] == color0)
		{
			Remap[0] = i;
			break;
		}
	}

	// If there is no duplicate of color 0, find the first set of duplicate
	// colors and make one of them a duplicate of color 0. In Hexen's PLAYPAL
	// colors 209 and 229 are the only duplicates, but we cannot assume
	// anything because the player might be using a custom PLAYPAL where those
	// entries are not duplicates.
	if (Remap[0] == 0)
	{
		PalEntry sortcopy[256];

		for (i = 0; i < 256; ++i)
		{
			sortcopy[i] = BaseColors[i] | (i << 24);
		}
		qsort (sortcopy, 256, 4, sortforremap);
		for (i = 255; i > 0; --i)
		{
			if ((sortcopy[i] & 0xFFFFFF) == (sortcopy[i-1] & 0xFFFFFF))
			{
				int new0 = sortcopy[i].a;
				int dup = sortcopy[i-1].a;
				if (new0 > dup)
				{
					// Make the lower-numbered entry a copy of color 0. (Just because.)
					swapvalues (new0, dup);
				}
				Remap[0] = new0;
				Remap[new0] = dup;
				BaseColors[new0] = color0;
				break;
			}
		}
	}

	// If there were no duplicates, InitPalette() will remap color 0 to the
	// closest matching color. Hopefully nobody will use a palette where all
	// 256 entries are different. :-)
}